

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void DoReadyWeaponToSwitch(AActor *self,bool switchable)

{
  player_t *ppVar1;
  player_t *player;
  bool switchable_local;
  AActor *self_local;
  
  if ((self != (AActor *)0x0) && (ppVar1 = self->player, ppVar1 != (player_t *)0x0)) {
    if (switchable) {
      ppVar1->WeaponState = ppVar1->WeaponState | 0x88;
    }
    else {
      ppVar1->WeaponState = ppVar1->WeaponState & 0xff7f;
    }
  }
  return;
}

Assistant:

void DoReadyWeaponToSwitch (AActor *self, bool switchable)
{
	// Prepare for switching action.
	player_t *player;
	if (self && (player = self->player))
	{
		if (switchable)
		{
			player->WeaponState |= WF_WEAPONSWITCHOK | WF_REFIRESWITCHOK;
		}
		else
		{
			// WF_WEAPONSWITCHOK is automatically cleared every tic by P_SetPsprite().
			player->WeaponState &= ~WF_REFIRESWITCHOK;
		}
	}
}